

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_test.c
# Opt level: O3

void ec_sync(int64 reftime,int64 cycletime,int64 *offsettime)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (reftime + -50000) % cycletime;
  lVar2 = 0;
  if (cycletime / 2 < lVar1) {
    lVar2 = cycletime;
  }
  gl_delta = lVar1 - lVar2;
  if (gl_delta == 0 || lVar1 < lVar2) {
    if (gl_delta < 0) {
      ec_sync::integral = ec_sync::integral + -1;
    }
  }
  else {
    ec_sync::integral = ec_sync::integral + 1;
  }
  lVar1 = SUB168(SEXT816(gl_delta) * SEXT816(0x5c28f5c28f5c28f5),8) - gl_delta;
  lVar2 = SUB168(SEXT816(ec_sync::integral) * SEXT816(-0x6666666666666667),8);
  *offsettime = ((lVar2 >> 3) - (lVar2 >> 0x3f)) + ((lVar1 >> 6) - (lVar1 >> 0x3f));
  return;
}

Assistant:

void ec_sync(int64 reftime, int64 cycletime , int64 *offsettime)
{
   static int64 integral = 0;
   int64 delta;
   /* set linux sync point 50us later than DC sync, just as example */
   delta = (reftime - 50000) % cycletime;
   if(delta> (cycletime / 2)) { delta= delta - cycletime; }
   if(delta>0){ integral++; }
   if(delta<0){ integral--; }
   *offsettime = -(delta / 100) - (integral / 20);
   gl_delta = delta;
}